

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureR32F(DrawTestBase *this,texture *texture)

{
  long lVar1;
  GLfloat data [32];
  undefined8 local_88 [16];
  
  lVar1 = 0;
  do {
    *(undefined8 *)((long)local_88 + lVar1 * 4) = 0xbf800000bf800000;
    *(undefined8 *)((long)local_88 + lVar1 * 4 + 8) = 0xbf800000bf800000;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x20);
  Utils::texture::create(texture,0x10,2,0x822e);
  Utils::texture::update(texture,0x10,2,0,0x1903,0x1406,local_88);
  return;
}

Assistant:

void DrawTestBase::prepareTextureR32F(Utils::texture& texture)
{
	static const GLuint size = m_r32f_width * m_r32f_height;
	GLfloat				data[size];

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1.0f;
	}

	texture.create(m_r32f_width, m_r32f_height, GL_R32F);
	texture.update(m_r32f_width, m_r32f_height, 0 /* depth */, GL_RED, GL_FLOAT, data);
}